

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

string * __thiscall
iDynTree::InverseKinematics::linearSolverName_abi_cxx11_(InverseKinematics *this)

{
  string *in_RDI;
  
  missingIpoptErrorReport();
  std::__cxx11::string::string(in_RDI);
  return in_RDI;
}

Assistant:

std::string InverseKinematics::linearSolverName()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->m_solverName;
#else
        missingIpoptErrorReport();
        return {};
#endif
    }